

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O2

void fdb_kvs_info_create(fdb_kvs_handle *root_handle,fdb_kvs_handle *handle,filemgr *file,
                        char *kvs_name)

{
  avl_node *paVar1;
  kvs_info *pkVar2;
  avl_node *paVar3;
  kvs_opened_node *pkVar4;
  pthread_spinlock_t *__lock;
  kvs_node query;
  
  pkVar2 = (kvs_info *)calloc(1,0x18);
  handle->kvs = pkVar2;
  if (root_handle == (fdb_kvs_handle *)0x0) {
    _fdb_kvs_init_root(handle,file);
    return;
  }
  pkVar2->type = '\x01';
  pkVar2->root = root_handle;
  if (kvs_name != (char *)0x0) {
    pthread_spin_lock(&file->kv_header->lock);
    query.kvs_name = kvs_name;
    paVar3 = avl_search(file->kv_header->idx_name,&query.avl_name,_kvs_cmp_name);
    if (paVar3 == (avl_node *)0x0) {
      free(handle->kvs);
      handle->kvs = (kvs_info *)0x0;
      __lock = &file->kv_header->lock;
      goto LAB_0012cd52;
    }
    handle->kvs->id = (fdb_kvs_id_t)paVar3[-7].right;
    paVar1 = paVar3[-5].parent;
    (handle->kvs_config).custom_cmp = (fdb_custom_cmp_variable)paVar3[-6].right;
    (handle->kvs_config).custom_cmp_param = paVar1;
    pthread_spin_unlock(&file->kv_header->lock);
  }
  pkVar4 = (kvs_opened_node *)calloc(1,0x18);
  pkVar4->handle = handle;
  handle->node = pkVar4;
  pthread_spin_lock(&root_handle->fhandle->lock);
  list_push_back(root_handle->fhandle->handles,&pkVar4->le);
  __lock = &root_handle->fhandle->lock;
LAB_0012cd52:
  pthread_spin_unlock(__lock);
  return;
}

Assistant:

void fdb_kvs_info_create(fdb_kvs_handle *root_handle,
                         fdb_kvs_handle *handle,
                         struct filemgr *file,
                         const char *kvs_name)
{
    struct kvs_node query, *kvs_node;
    struct kvs_opened_node *opened_node;
    struct avl_node *a;

    handle->kvs = (struct kvs_info*)calloc(1, sizeof(struct kvs_info));

    if (root_handle == NULL) {
        // 'handle' is a super handle
        _fdb_kvs_init_root(handle, file);
    } else {
        // 'handle' is a sub handle (i.e., KV instance in a DB instance)
        handle->kvs->type = KVS_SUB;
        handle->kvs->root = root_handle;

        if (kvs_name) {
            spin_lock(&file->kv_header->lock);
            query.kvs_name = (char*)kvs_name;
            a = avl_search(file->kv_header->idx_name, &query.avl_name,
                           _kvs_cmp_name);
            if (a == NULL) {
                // KV instance name is not found
                free(handle->kvs);
                handle->kvs = NULL;
                spin_unlock(&file->kv_header->lock);
                return;
            }
            kvs_node = _get_entry(a, struct kvs_node, avl_name);
            handle->kvs->id = kvs_node->id;
            // force custom cmp function
            handle->kvs_config.custom_cmp = kvs_node->custom_cmp;
            handle->kvs_config.custom_cmp_param = kvs_node->user_param;
            spin_unlock(&file->kv_header->lock);
        } else {
            // snapshot of the root handle
            handle->kvs->id = 0;
        }

        opened_node = (struct kvs_opened_node *)
               calloc(1, sizeof(struct kvs_opened_node));
        opened_node->handle = handle;

        handle->node = opened_node;
        spin_lock(&root_handle->fhandle->lock);
        list_push_back(root_handle->fhandle->handles, &opened_node->le);
        spin_unlock(&root_handle->fhandle->lock);
    }
}